

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getPrimalSol(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *p_vector)

{
  undefined8 *puVar1;
  uint *puVar2;
  uint *puVar3;
  DataKey DVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  Status SVar14;
  pointer pnVar15;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  undefined8 *puVar17;
  long lVar18;
  long lVar19;
  DataKey local_58;
  long local_50;
  undefined1 local_48 [16];
  DataKey local_38;
  
  if (this->initialized == false) {
    SVar14 = status(this);
    if (SVar14 == NO_PROBLEM) {
      SVar14 = status(this);
      return SVar14;
    }
    puVar17 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_58 = (DataKey)local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"XSOLVE06 Not Initialized","");
    *puVar17 = &PTR__SPxException_0069d438;
    puVar17[1] = puVar17 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar17 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
    *puVar17 = &PTR__SPxException_0069d650;
    __cxa_throw(puVar17,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  if (this->theRep == ROW) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(p_vector,&this->theCoPvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
  }
  else {
    if (0 < (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      lVar19 = 0;
      lVar18 = 0;
      do {
        switch((this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.colstat.data[lVar18]) {
        case D_FREE:
        case D_ON_UPPER:
        case D_ON_LOWER:
        case D_ON_BOTH:
        case D_UNDEFINED:
          break;
        case P_FIXED:
        case P_ON_UPPER:
          pnVar15 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_0038ec54;
        default:
          puVar17 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_58 = (DataKey)local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"XSOLVE07 This should never happen.","");
          *puVar17 = &PTR__SPxException_0069d438;
          puVar17[1] = puVar17 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar17 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
          *puVar17 = &PTR__SPxException_0069d410;
          __cxa_throw(puVar17,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        case P_ON_LOWER:
          pnVar15 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_0038ec54:
          pnVar5 = (p_vector->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar17 = (undefined8 *)((long)&(pnVar15->m_backend).data + lVar19);
          uVar6 = *puVar17;
          uVar7 = puVar17[1];
          puVar17 = (undefined8 *)((long)&(pnVar15->m_backend).data + lVar19 + 0x10);
          uVar8 = *puVar17;
          uVar9 = puVar17[1];
          puVar17 = (undefined8 *)((long)&(pnVar15->m_backend).data + lVar19 + 0x20);
          uVar10 = *puVar17;
          uVar11 = puVar17[1];
          puVar17 = (undefined8 *)((long)&(pnVar15->m_backend).data + lVar19 + 0x30);
          uVar12 = puVar17[1];
          puVar1 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar19 + 0x30);
          *puVar1 = *puVar17;
          puVar1[1] = uVar12;
          puVar17 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar19 + 0x20);
          *puVar17 = uVar10;
          puVar17[1] = uVar11;
          puVar17 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar19 + 0x10);
          *puVar17 = uVar8;
          puVar17[1] = uVar9;
          puVar17 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar19);
          *puVar17 = uVar6;
          puVar17[1] = uVar7;
          *(undefined4 *)((long)&(pnVar5->m_backend).data + lVar19 + 0x40) =
               *(undefined4 *)((long)&(pnVar15->m_backend).data + lVar19 + 0x40);
          *(undefined1 *)((long)&(pnVar5->m_backend).data + lVar19 + 0x44) =
               *(undefined1 *)((long)&(pnVar15->m_backend).data + lVar19 + 0x44);
          *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar19 + 0x48) =
               *(undefined8 *)((long)&(pnVar15->m_backend).data + lVar19 + 0x48);
          break;
        case P_FREE:
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    ((cpp_dec_float<100U,_int,_void> *)
                     ((long)&(((p_vector->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar19)
                     ,0);
        }
        lVar18 = lVar18 + 1;
        lVar19 = lVar19 + 0x50;
      } while (lVar18 < (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    pSVar16 = this->thecovectors;
    if (0 < (pSVar16->set).thenum) {
      lVar18 = 9;
      lVar19 = 0;
      do {
        DVar4 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).theBaseId.data[lVar19].super_DataKey;
        if (0 < DVar4.info) {
          pnVar15 = (this->theFvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_38 = DVar4;
          SPxColId::SPxColId((SPxColId *)&local_58,(SPxId *)&local_38);
          iVar13 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   ::number(&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set,&local_58);
          pnVar5 = (p_vector->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (uint *)((long)&pnVar15->m_backend + lVar18 * 8 + -0x48);
          uVar6 = *(undefined8 *)(puVar2 + 2);
          puVar3 = (uint *)((long)&pnVar15->m_backend + lVar18 * 8 + -0x38);
          uVar7 = *(undefined8 *)puVar3;
          uVar8 = *(undefined8 *)(puVar3 + 2);
          puVar3 = (uint *)((long)&pnVar15->m_backend + lVar18 * 8 + -0x28);
          uVar9 = *(undefined8 *)puVar3;
          uVar10 = *(undefined8 *)(puVar3 + 2);
          puVar3 = (uint *)((long)&pnVar15->m_backend + lVar18 * 8 + -0x18);
          uVar11 = *(undefined8 *)puVar3;
          uVar12 = *(undefined8 *)(puVar3 + 2);
          *(undefined8 *)&pnVar5[iVar13].m_backend.data = *(undefined8 *)puVar2;
          *(undefined8 *)((long)&pnVar5[iVar13].m_backend.data + 8) = uVar6;
          puVar2 = (uint *)((long)&pnVar5[iVar13].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = uVar7;
          *(undefined8 *)(puVar2 + 2) = uVar8;
          puVar2 = (uint *)((long)&pnVar5[iVar13].m_backend.data + 0x20);
          *(undefined8 *)puVar2 = uVar9;
          *(undefined8 *)(puVar2 + 2) = uVar10;
          puVar2 = (uint *)((long)&pnVar5[iVar13].m_backend.data + 0x30);
          *(undefined8 *)puVar2 = uVar11;
          *(undefined8 *)(puVar2 + 2) = uVar12;
          pnVar5[iVar13].m_backend.exp =
               *(fpclass_type *)((long)&pnVar15->m_backend + lVar18 * 8 + -8);
          pnVar5[iVar13].m_backend.neg =
               SUB41(*(int32_t *)((long)&pnVar15->m_backend + lVar18 * 8 + -4),0);
          uVar6 = *(undefined8 *)((long)&pnVar15->m_backend + lVar18 * 8);
          pnVar5[iVar13].m_backend.fpclass = (int)uVar6;
          pnVar5[iVar13].m_backend.prec_elem = (int)((ulong)uVar6 >> 0x20);
          pSVar16 = this->thecovectors;
        }
        lVar19 = lVar19 + 1;
        lVar18 = lVar18 + 10;
      } while (lVar19 < (pSVar16->set).thenum);
    }
  }
  SVar14 = status(this);
  return SVar14;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getPrimalSol(VectorBase<R>& p_vector) const
{

   if(!isInitialized())
   {
      /* exit if presolving/simplifier cleared the problem */
      if(status() == NO_PROBLEM)
         return status();

      throw SPxStatusException("XSOLVE06 Not Initialized");
   }

   if(rep() == ROW)
      p_vector = coPvec();
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            p_vector[i] = SPxLPBase<R>::lower(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::P_FIXED :
            p_vector[i] = SPxLPBase<R>::upper(i);
            break;

         case SPxBasisBase<R>::Desc::P_FREE :
            p_vector[i] = 0;
            break;

         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_BOTH :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
            break;

         default:
            throw SPxInternalCodeException("XSOLVE07 This should never happen.");
         }
      }

      for(int j = 0; j < dim(); ++j)
      {
         if(this->baseId(j).isSPxColId())
            p_vector[ this->number(SPxColId(this->baseId(j))) ] = fVec()[j];
      }
   }

   return status();
}